

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

void Curl_ssl_cleanup(void)

{
  if (init_ssl == '\x01') {
    if (Curl_ssl->cleanup != (_func_void *)0x0) {
      (*Curl_ssl->cleanup)();
    }
    init_ssl = '\0';
  }
  return;
}

Assistant:

void Curl_ssl_cleanup(void)
{
  if(init_ssl) {
    /* only cleanup if we did a previous init */
    if(Curl_ssl->cleanup)
      Curl_ssl->cleanup();
#if defined(CURL_WITH_MULTI_SSL)
    Curl_ssl = &Curl_ssl_multi;
#endif
    init_ssl = FALSE;
  }
}